

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int av1_tpl_setup_stats(AV1_COMP *cpi,int gop_eval,EncodeFrameParams *frame_params)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  int iVar4;
  AV1_COMMON *cm_00;
  long lVar5;
  undefined4 *puVar6;
  void *in_RDX;
  int in_ESI;
  long *in_RDI;
  int frame_idx_1;
  int frame_idx_0;
  double beta [2];
  int frame_idx_2;
  int frame_idx;
  int reduce_num_frames;
  int num_planes;
  TplBuffers *tpl_tmp_buffers;
  int tpl_gf_group_frames;
  int pframe_qindex;
  int gf_index;
  int approx_gop_eval;
  TplParams *tpl_data;
  EncodeFrameParams this_frame_params;
  GF_GROUP *gf_group;
  AV1TplRowMultiThreadInfo *tpl_row_mt;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  AV1_COMP *in_stack_00000100;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  GF_GROUP *gf_group_00;
  TplParams *in_stack_ffffffffffffff10;
  TplParams *tpl_data_00;
  uint in_stack_ffffffffffffff18;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar8;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  double local_d8;
  AV1_COMP *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  int local_a8;
  undefined4 local_a4;
  uint local_a0;
  TplParams *in_stack_ffffffffffffff70;
  undefined2 local_48;
  undefined1 local_46;
  long *plVar9;
  long *plVar10;
  int local_4;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  plVar10 = in_RDI + 0x135c9;
  plVar9 = in_RDI + 0x135ff;
  lVar5 = *in_RDI + 400;
  memcpy(&stack0xffffffffffffff74,in_RDX,0x4c);
  puVar6 = (undefined4 *)(*in_RDI + 0xd2a8);
  if ((int)in_RDI[0x13a99] == 0) {
    (cm_00->current_frame).frame_type = *(FRAME_TYPE *)((long)in_RDX + 4);
    for (local_a0 = (uint)*(byte *)(in_RDI + 0xe258); (int)local_a0 < *(int *)(lVar5 + 0x1878);
        local_a0 = local_a0 + 1) {
      (cm_00->current_frame).frame_type = *(FRAME_TYPE *)(lVar5 + 0x1680 + (long)(int)local_a0);
      av1_configure_buffer_updates
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (RefreshFrameInfo *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (FRAME_UPDATE_TYPE)((ulong)in_stack_ffffffffffffff10 >> 0x38),
                 (REFBUF_STATE)((ulong)in_stack_ffffffffffffff10 >> 0x30),
                 (int)in_stack_ffffffffffffff10);
      *(undefined2 *)(in_RDI + 0x85af) = local_48;
      *(undefined1 *)((long)in_RDI + 0x42d7a) = local_46;
    }
    init_gop_frames_for_tpl
              ((AV1_COMP *)this_frame_params.remapped_ref_idx._0_8_,
               (EncodeFrameParams *)this_frame_params._28_8_,(GF_GROUP *)this_frame_params._20_8_,
               (int *)this_frame_params._12_8_,(int *)this_frame_params._4_8_);
    *(undefined4 *)(*in_RDI + 0xac90) = local_a4;
    av1_init_tpl_stats(in_stack_ffffffffffffff10);
    _Var1 = tpl_alloc_temp_buffers
                      ((TplBuffers *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       '\0');
    if (!_Var1) {
      aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                         "Error allocating tpl data");
    }
    plVar9[2] = (long)av1_tpl_row_mt_sync_read_dummy;
    plVar9[3] = (long)av1_tpl_row_mt_sync_write_dummy;
    av1_setup_scale_factors_for_frame
              ((scale_factors *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0,0x320f17);
    if (*(char *)((long)in_RDX + 4) == '\0') {
      av1_init_mv_probs((AV1_COMMON *)0x320f35);
    }
    av1_fill_mv_costs((nmv_context *)in_stack_ffffffffffffff10,
                      (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08
                      ,(MvCosts *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    if (*(int *)((long)in_RDI + 0x60924) == 0) {
      iVar8 = av1_num_planes(cm_00);
    }
    else {
      iVar8 = 1;
    }
    uVar7 = in_stack_ffffffffffffff18 & 0xffffff;
    if ((*(int *)((long)in_RDI + 0x6092c) != 0) &&
       (uVar7 = in_stack_ffffffffffffff18 & 0xffffff,
       *(char *)(lVar5 + (ulong)*(byte *)(in_RDI + 0xe258)) != '\0')) {
      uVar7 = CONCAT13(2 < *(int *)(lVar5 + 0xac0),(int3)in_stack_ffffffffffffff18);
    }
    gf_group_00 = (GF_GROUP *)0x3ff0000000000000;
    tpl_data_00 = (TplParams *)0x3ff999999999999a;
    if (uVar7 >> 0x18 == 0) {
      tpl_data_00 = (TplParams *)0x3ff0000000000000;
    }
    *(TplParams **)(puVar6 + 0x142c) = tpl_data_00;
    uVar3 = (uint)*(byte *)(in_RDI + 0xe258);
    while( true ) {
      if (local_a8 <= (int)uVar3) break;
      iVar2 = skip_tpl_for_frame(gf_group_00,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
      if (iVar2 == 0) {
        init_mc_flow_dispenser(in_stack_00000100,cpi._4_4_,(int)cpi);
        if ((int)*plVar10 < 2) {
          mc_flow_dispenser(in_stack_ffffffffffffff30);
        }
        else {
          plVar9[2] = (long)av1_tpl_row_mt_sync_read;
          plVar9[3] = (long)av1_tpl_row_mt_sync_write;
          av1_mc_flow_dispenser_mt((AV1_COMP *)CONCAT44(uVar3,in_stack_ffffffffffffff40));
        }
        aom_extend_frame_borders_c
                  ((YV12_BUFFER_CONFIG *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc);
      }
      uVar3 = uVar3 + 1;
    }
    for (iVar2 = local_a8 + -1; (int)(uint)*(byte *)(in_RDI + 0xe258) <= iVar2; iVar2 = iVar2 + -1)
    {
      iVar4 = skip_tpl_for_frame(gf_group_00,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
      if (iVar4 == 0) {
        mc_flow_synthesizer(tpl_data_00,(int)((ulong)gf_group_00 >> 0x20),(int)gf_group_00,
                            in_stack_ffffffffffffff04);
      }
    }
    av1_configure_buffer_updates
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (RefreshFrameInfo *)CONCAT44(iVar8,uVar7),
               (FRAME_UPDATE_TYPE)((ulong)tpl_data_00 >> 0x38),
               (REFBUF_STATE)((ulong)tpl_data_00 >> 0x30),(int)tpl_data_00);
    (cm_00->current_frame).frame_type = *(FRAME_TYPE *)((long)in_RDX + 4);
    *(undefined4 *)(in_RDI + 0x782c) = *(undefined4 *)((long)in_RDX + 0x10);
    tpl_dealloc_temp_buffers((TplBuffers *)0x32124d);
    if (in_ESI < 2) {
      *puVar6 = 1;
    }
    if (*(int *)((long)in_RDI + 0x42264) == 0) {
      if (*(int *)(lVar5 + 0xac4) == 0) {
        local_4 = 1;
      }
      else if (in_ESI == 0) {
        local_4 = 0;
      }
      else {
        memset(&local_d8,0,0x10);
        iVar8 = (int)((ulong)puVar6 >> 0x20);
        local_d8 = get_frame_importance(in_stack_ffffffffffffff70,iVar8);
        get_frame_importance(in_stack_ffffffffffffff70,iVar8);
        local_4 = eval_gop_length(&local_d8,in_ESI);
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    av1_init_tpl_stats(in_stack_ffffffffffffff10);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_tpl_setup_stats(AV1_COMP *cpi, int gop_eval,
                        const EncodeFrameParams *const frame_params) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_tpl_setup_stats_time);
#endif
  assert(cpi->gf_frame_index == 0);
  AV1_COMMON *cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &mt_info->tpl_row_mt;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  EncodeFrameParams this_frame_params = *frame_params;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  int approx_gop_eval = (gop_eval > 1);

  if (cpi->superres_mode != AOM_SUPERRES_NONE) {
    assert(cpi->superres_mode != AOM_SUPERRES_AUTO);
    av1_init_tpl_stats(tpl_data);
    return 0;
  }

  cm->current_frame.frame_type = frame_params->frame_type;
  for (int gf_index = cpi->gf_frame_index; gf_index < gf_group->size;
       ++gf_index) {
    cm->current_frame.frame_type = gf_group->frame_type[gf_index];
    av1_configure_buffer_updates(cpi, &this_frame_params.refresh_frame,
                                 gf_group->update_type[gf_index],
                                 gf_group->refbuf_state[gf_index], 0);

    memcpy(&cpi->refresh_frame, &this_frame_params.refresh_frame,
           sizeof(cpi->refresh_frame));
  }

  int pframe_qindex;
  int tpl_gf_group_frames;
  init_gop_frames_for_tpl(cpi, frame_params, gf_group, &tpl_gf_group_frames,
                          &pframe_qindex);

  cpi->ppi->p_rc.base_layer_qp = pframe_qindex;

  av1_init_tpl_stats(tpl_data);

  TplBuffers *tpl_tmp_buffers = &cpi->td.tpl_tmp_buffers;
  if (!tpl_alloc_temp_buffers(tpl_tmp_buffers, tpl_data->tpl_bsize_1d)) {
    aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                       "Error allocating tpl data");
  }

  tpl_row_mt->sync_read_ptr = av1_tpl_row_mt_sync_read_dummy;
  tpl_row_mt->sync_write_ptr = av1_tpl_row_mt_sync_write_dummy;

  av1_setup_scale_factors_for_frame(&cm->sf_identity, cm->width, cm->height,
                                    cm->width, cm->height);

  if (frame_params->frame_type == KEY_FRAME) {
    av1_init_mv_probs(cm);
  }
  av1_fill_mv_costs(&cm->fc->nmvc, cm->features.cur_frame_force_integer_mv,
                    cm->features.allow_high_precision_mv, cpi->td.mb.mv_costs);

  const int num_planes =
      cpi->sf.tpl_sf.use_y_only_rate_distortion ? 1 : av1_num_planes(cm);
  // As tpl module is called before the setting of speed features at frame
  // level, turning off this speed feature for the first GF group of the
  // key-frame interval is done here.
  int reduce_num_frames =
      cpi->sf.tpl_sf.reduce_num_frames &&
      gf_group->update_type[cpi->gf_frame_index] != KF_UPDATE &&
      gf_group->max_layer_depth > 2;
  // TPL processing is skipped for frames of type LF_UPDATE when
  // 'reduce_num_frames' is 1, which affects the r0 calcuation. Thus, a factor
  // to adjust r0 is used. The value of 1.6 corresponds to using ~60% of the
  // frames in the gf group on an average.
  tpl_data->r0_adjust_factor = reduce_num_frames ? 1.6 : 1.0;

  // Backward propagation from tpl_group_frames to 1.
  for (int frame_idx = cpi->gf_frame_index; frame_idx < tpl_gf_group_frames;
       ++frame_idx) {
    if (skip_tpl_for_frame(gf_group, frame_idx, gop_eval, approx_gop_eval,
                           reduce_num_frames))
      continue;

    init_mc_flow_dispenser(cpi, frame_idx, pframe_qindex);
    if (mt_info->num_workers > 1) {
      tpl_row_mt->sync_read_ptr = av1_tpl_row_mt_sync_read;
      tpl_row_mt->sync_write_ptr = av1_tpl_row_mt_sync_write;
      av1_mc_flow_dispenser_mt(cpi);
    } else {
      mc_flow_dispenser(cpi);
    }
#if CONFIG_BITRATE_ACCURACY
    av1_tpl_txfm_stats_update_abs_coeff_mean(&cpi->td.tpl_txfm_stats);
    av1_tpl_store_txfm_stats(tpl_data, &cpi->td.tpl_txfm_stats, frame_idx);
#endif  // CONFIG_BITRATE_ACCURACY
#if CONFIG_RATECTRL_LOG && CONFIG_THREE_PASS && CONFIG_BITRATE_ACCURACY
    if (cpi->oxcf.pass == AOM_RC_THIRD_PASS) {
      int frame_coding_idx =
          av1_vbr_rc_frame_coding_idx(&cpi->vbr_rc_info, frame_idx);
      rc_log_frame_stats(&cpi->rc_log, frame_coding_idx,
                         &cpi->td.tpl_txfm_stats);
    }
#endif  // CONFIG_RATECTRL_LOG

    aom_extend_frame_borders(tpl_data->tpl_frame[frame_idx].rec_picture,
                             num_planes);
  }

  for (int frame_idx = tpl_gf_group_frames - 1;
       frame_idx >= cpi->gf_frame_index; --frame_idx) {
    if (skip_tpl_for_frame(gf_group, frame_idx, gop_eval, approx_gop_eval,
                           reduce_num_frames))
      continue;

    mc_flow_synthesizer(tpl_data, frame_idx, cm->mi_params.mi_rows,
                        cm->mi_params.mi_cols);
  }

  av1_configure_buffer_updates(cpi, &this_frame_params.refresh_frame,
                               gf_group->update_type[cpi->gf_frame_index],
                               gf_group->update_type[cpi->gf_frame_index], 0);
  cm->current_frame.frame_type = frame_params->frame_type;
  cm->show_frame = frame_params->show_frame;

#if CONFIG_COLLECT_COMPONENT_TIMING
  // Record the time if the function returns.
  if (cpi->common.tiles.large_scale || gf_group->max_layer_depth_allowed == 0 ||
      !gop_eval)
    end_timing(cpi, av1_tpl_setup_stats_time);
#endif

  tpl_dealloc_temp_buffers(tpl_tmp_buffers);

  if (!approx_gop_eval) {
    tpl_data->ready = 1;
  }
  if (cpi->common.tiles.large_scale) return 0;
  if (gf_group->max_layer_depth_allowed == 0) return 1;
  if (!gop_eval) return 0;
  assert(gf_group->arf_index >= 0);

  double beta[2] = { 0.0 };
  const int frame_idx_0 = gf_group->arf_index;
  const int frame_idx_1 =
      AOMMIN(tpl_gf_group_frames - 1, gf_group->arf_index + 1);
  beta[0] = get_frame_importance(tpl_data, frame_idx_0);
  beta[1] = get_frame_importance(tpl_data, frame_idx_1);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_tpl_setup_stats_time);
#endif
  return eval_gop_length(beta, gop_eval);
}